

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>
::AddTestPattern(ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>
                 *this,char *test_suite_name,char *test_base_name,
                TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
                *meta_factory,CodeLocation *code_location)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong uVar4;
  pointer psVar5;
  ulong uVar6;
  pointer psVar7;
  pointer psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar9;
  long lVar10;
  allocator local_69;
  pointer local_68;
  ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC> *local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  int local_38;
  
  peVar2 = (element_type *)operator_new(0x70);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,meta_factory->_vptr_TestMetaFactoryBase,
             (long)meta_factory[1]._vptr_TestMetaFactoryBase +
             (long)meta_factory->_vptr_TestMetaFactoryBase);
  local_38 = *(int *)&meta_factory[4]._vptr_TestMetaFactoryBase;
  (peVar2->test_suite_base_name)._M_dataplus._M_p = (pointer)&(peVar2->test_suite_base_name).field_2
  ;
  (peVar2->test_suite_base_name).field_2._M_allocated_capacity = 0x6574617261746144;
  *(undefined8 *)((long)&(peVar2->test_suite_base_name).field_2 + 7) = 0x4356537473655465;
  (peVar2->test_suite_base_name)._M_string_length = 0xf;
  (peVar2->test_suite_base_name).field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)&peVar2->test_base_name,test_suite_name,&local_69);
  (peVar2->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>_*,_false>
       = (_Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>_*,_false>
          )test_base_name;
  (peVar2->code_location).file._M_dataplus._M_p = (pointer)&(peVar2->code_location).file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&peVar2->code_location,local_58,local_58 + local_50);
  (peVar2->code_location).line = local_38;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_010314d0;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)peVar2;
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == (this->tests_).
                super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_68 = (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = (long)psVar1 - (long)local_68;
    local_60 = this;
    if (lVar10 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar4 = lVar10 >> 4;
    uVar6 = 1;
    if (psVar1 != local_68) {
      uVar6 = uVar4;
    }
    uVar9 = uVar6 + uVar4;
    if (0x7fffffffffffffe < uVar9) {
      uVar9 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar6,uVar4)) {
      uVar9 = 0x7ffffffffffffff;
    }
    psVar5 = (pointer)operator_new(uVar9 * 0x10);
    *(element_type **)((long)psVar5 + lVar10) = peVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)psVar5 + lVar10 + 8) = p_Var3;
    psVar8 = psVar5;
    for (psVar7 = local_68; psVar1 != psVar7; psVar7 = psVar7 + 1) {
      peVar2 = (psVar7->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var3 = (psVar7->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (psVar7->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar2;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = p_Var3;
      (psVar7->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)0x0;
      psVar8 = psVar8 + 1;
    }
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68);
    }
    (local_60->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar5;
    (local_60->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar8 + 1;
    (local_60->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar5 + uVar9;
  }
  else {
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar2;
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = p_Var3;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1 + 1;
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }